

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall
QTableModel::insertColumns(QTableModel *this,int column,int count,QModelIndex *param_3)

{
  qsizetype qVar1;
  qsizetype qVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong i;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((column < 0 || count < 1) ||
     (i = (ulong)(uint)column, (ulong)(this->horizontalHeaderItems).d.size < i)) {
    bVar3 = false;
  }
  else {
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    QAbstractItemModel::beginInsertColumns((QModelIndex *)this,(int)&local_50,column);
    qVar1 = (this->verticalHeaderItems).d.size;
    qVar2 = (this->horizontalHeaderItems).d.size;
    QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
              ((QPodArrayOps<QTableWidgetItem_*> *)&this->horizontalHeaderItems,i,(ulong)(uint)count
               ,(parameter_type)0x0);
    QList<QTableWidgetItem_*>::begin(&this->horizontalHeaderItems);
    uVar4 = (uint)qVar1;
    if ((int)qVar2 == 0) {
      QList<QTableWidgetItem_*>::resize(&this->tableItems,(long)(int)(count * uVar4));
    }
    else if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
                  ((QPodArrayOps<QTableWidgetItem_*> *)&this->tableItems,
                   (this->horizontalHeaderItems).d.size * uVar5 + i,(ulong)(uint)count,
                   (parameter_type)0x0);
        QList<QTableWidgetItem_*>::begin(&this->tableItems);
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
    QAbstractItemModel::endInsertColumns();
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QTableModel::insertColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column > horizontalHeaderItems.size())
        return false;

    beginInsertColumns(QModelIndex(), column, column + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    horizontalHeaderItems.insert(column, count, 0);
    if (cc == 0)
        tableItems.resize(rc * count);
    else
        for (int row = 0; row < rc; ++row)
            tableItems.insert(tableIndex(row, column), count, 0);
    endInsertColumns();
    return true;
}